

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O3

void __thiscall CNetMessage::CNetMessage(CNetMessage *this,CNetMessage *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer pcVar4;
  undefined4 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pbVar10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar10 = (param_1->m_recv).vch.
            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar10;
  (this->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->m_recv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recv).m_read_pos = (param_1->m_recv).m_read_pos;
  uVar5 = *(undefined4 *)((long)&(param_1->m_time).__r + 4);
  uVar6 = param_1->m_message_size;
  uVar7 = param_1->m_raw_message_size;
  *(int *)&(this->m_time).__r = (int)(param_1->m_time).__r;
  *(undefined4 *)((long)&(this->m_time).__r + 4) = uVar5;
  this->m_message_size = uVar6;
  this->m_raw_message_size = uVar7;
  paVar1 = &(this->m_type).field_2;
  (this->m_type)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (param_1->m_type)._M_dataplus._M_p;
  paVar2 = &(param_1->m_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined4 *)((long)&(param_1->m_type).field_2 + 4);
    uVar8 = *(undefined4 *)((long)&(param_1->m_type).field_2 + 8);
    uVar9 = *(undefined4 *)((long)&(param_1->m_type).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->m_type).field_2 + 4) = uVar5;
    *(undefined4 *)((long)&(this->m_type).field_2 + 8) = uVar8;
    *(undefined4 *)((long)&(this->m_type).field_2 + 0xc) = uVar9;
  }
  else {
    (this->m_type)._M_dataplus._M_p = pcVar4;
    (this->m_type).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_type)._M_string_length = (param_1->m_type)._M_string_length;
  (param_1->m_type)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->m_type)._M_string_length = 0;
  (param_1->m_type).field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage(CNetMessage&&) = default;